

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  CppType CVar1;
  Extension *pEVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  Extension *extension;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  LogMessage *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  LogLevel_conflict in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  ExtensionSet *in_stack_ffffffffffffff38;
  
  pEVar2 = FindOrNull(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,(char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c
              );
    LogMessage::operator<<
              (in_stack_ffffffffffffff20,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    LogMessage::operator<<
              (in_stack_ffffffffffffff20,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff20,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    LogMessage::~LogMessage((LogMessage *)0x491cff);
  }
  CVar1 = anon_unknown_19::cpp_type('\0');
  this_00 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(ulong)(CVar1 - CPPTYPE_INT32);
  switch(this_00) {
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0:
    RepeatedField<int>::SwapElements
              ((RepeatedField<int> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x1:
    RepeatedField<long>::SwapElements
              ((RepeatedField<long> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x2:
    RepeatedField<unsigned_int>::SwapElements
              ((RepeatedField<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x3:
    RepeatedField<unsigned_long>::SwapElements
              ((RepeatedField<unsigned_long> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x4:
    RepeatedField<double>::SwapElements
              ((RepeatedField<double> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x5:
    RepeatedField<float>::SwapElements
              ((RepeatedField<float> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
               ,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x6:
    RepeatedField<bool>::SwapElements
              ((RepeatedField<bool> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x7:
    RepeatedField<int>::SwapElements
              ((RepeatedField<int> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x8:
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::SwapElements(this_00,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    break;
  case (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x9:
    RepeatedPtrField<google::protobuf::MessageLite>::SwapElements
              ((RepeatedPtrField<google::protobuf::MessageLite> *)this_00,in_stack_ffffffffffffff1c,
               in_stack_ffffffffffffff18);
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}